

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O0

int CivetServer::authHandler(mg_connection *conn,void *cbdata)

{
  uint uVar1;
  mapped_type *this;
  CivetAuthHandler *handler;
  CivetConnection local_48;
  void *local_30;
  CivetServer *me;
  mg_request_info *request_info;
  void *cbdata_local;
  mg_connection *conn_local;
  
  request_info = (mg_request_info *)cbdata;
  cbdata_local = conn;
  me = (CivetServer *)mg_get_request_info(conn);
  local_30 = ((mg_request_info *)me)->user_data;
  if (*(long *)((long)local_30 + 8) == 0) {
    conn_local._4_4_ = 0;
  }
  else {
    mg_lock_context(*(mg_context **)((long)local_30 + 8));
    local_48.postData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Tp_alloc_type =
         (_Tp_alloc_type)0x0;
    local_48.postData.super__Vector_base<char,_std::allocator<char>_>._M_impl._1_7_ = 0;
    local_48.postData.super__Vector_base<char,_std::allocator<char>_>._M_impl._8_8_ = 0;
    local_48.postData.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = 0;
    CivetConnection::CivetConnection(&local_48);
    this = std::
           map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
           ::operator[]((map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
                         *)((long)local_30 + 0x10),(key_type *)&cbdata_local);
    CivetConnection::operator=(this,&local_48);
    CivetConnection::~CivetConnection(&local_48);
    mg_unlock_context(*(mg_context **)((long)local_30 + 8));
    if (request_info == (mg_request_info *)0x0) {
      conn_local._4_4_ = 0;
    }
    else {
      uVar1 = (**(code **)(request_info->request_method + 0x10))(request_info,local_30,cbdata_local)
      ;
      conn_local._4_4_ = (uint)((uVar1 & 1) != 0);
    }
  }
  return conn_local._4_4_;
}

Assistant:

int
CivetServer::authHandler(struct mg_connection *conn, void *cbdata)
{
	const struct mg_request_info *request_info = mg_get_request_info(conn);
	assert(request_info != NULL);
	CivetServer *me = (CivetServer *)(request_info->user_data);
	assert(me != NULL);

	// Happens when a request hits the server before the context is saved
	if (me->context == NULL)
		return 0;

	mg_lock_context(me->context);
	me->connections[conn] = CivetConnection();
	mg_unlock_context(me->context);

	CivetAuthHandler *handler = (CivetAuthHandler *)cbdata;

	if (handler) {
		return handler->authorize(me, conn) ? 1 : 0;
	}

	return 0; // No handler found
}